

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::x86::X86RAPass::_rewrite(X86RAPass *this,BaseNode *first,BaseNode *stop)

{
  bool bVar1;
  NodeType NVar2;
  RegType RVar3;
  uint32_t uVar4;
  Error EVar5;
  int32_t offset_00;
  Compiler *pCVar6;
  BaseNode *pBVar7;
  Operand_ *this_00;
  LabelNode *this_01;
  VirtReg *this_02;
  RAWorkReg *this_03;
  RAStackSlot *this_04;
  InstNode *in_RDX;
  InstNode *in_RSI;
  X86RAPass *in_RDI;
  Label LVar8;
  int32_t offset;
  RAStackSlot *slot;
  RAWorkReg *workReg;
  VirtReg *virtReg;
  uint32_t virtIndex;
  BaseMem *mem;
  Operand *op;
  BaseNode *prev;
  Error _err;
  RABlock *block;
  uint32_t outId;
  BitWordIterator<unsigned_int> outIt;
  uint32_t useId;
  BitWordIterator<unsigned_int> useIt;
  RATiedReg *tiedReg;
  uint32_t tiedCount;
  RATiedReg *tiedRegs;
  uint32_t i;
  uint32_t maxRegId;
  uint32_t opCount;
  Operand *operands;
  RAInst *raInst;
  InstNode *inst;
  BaseNode *next;
  BaseNode *node;
  uint32_t virtCount;
  char *in_stack_000002c0;
  int in_stack_000002cc;
  char *in_stack_000002d0;
  LabelNode *in_stack_fffffffffffffec8;
  uint32_t index;
  InstId in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  BaseRAPass *in_stack_fffffffffffffed8;
  InstNode *in_stack_fffffffffffffee0;
  BaseBuilder *in_stack_fffffffffffffee8;
  undefined1 local_a4 [16];
  undefined4 local_94;
  RABlock *local_90;
  uint32_t local_88;
  BitWordIterator<unsigned_int> local_84;
  uint32_t local_80;
  BitWordIterator<unsigned_int> local_7c;
  RATiedReg *local_78;
  uint local_6c;
  RATiedReg *local_68;
  uint local_5c;
  uint local_58;
  uint32_t local_54;
  Operand *local_50;
  RAInst *local_48;
  InstNode *local_40;
  InstNode *local_38;
  InstNode *local_30;
  size_type local_24;
  InstNode *local_20;
  InstNode *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  pCVar6 = cc(in_RDI);
  local_24 = ZoneVectorBase::size(&(pCVar6->super_BaseCompiler)._vRegArray.super_ZoneVectorBase);
  local_30 = local_18;
  do {
    if (local_30 == local_20) {
      return 0;
    }
    local_38 = (InstNode *)BaseNode::next(&local_30->super_BaseNode);
    bVar1 = BaseNode::isInst((BaseNode *)0x19e5ff);
    if (bVar1) {
      local_40 = BaseNode::as<asmjit::_abi_1_10::InstNode>(&local_30->super_BaseNode);
      local_48 = BaseNode::passData<asmjit::_abi_1_10::RAInst>(&local_30->super_BaseNode);
      local_50 = InstNode::operands(local_40);
      local_54 = InstNode::opCount(local_40);
      local_58 = 0;
      if (local_48 != (RAInst *)0x0) {
        BaseNode::resetPassData(&local_30->super_BaseNode);
        local_68 = RAInst::tiedRegs(local_48);
        local_6c = RAInst::tiedCount(local_48);
        for (local_5c = 0; local_5c < local_6c; local_5c = local_5c + 1) {
          local_78 = local_68 + local_5c;
          uVar4 = RATiedReg::useRewriteMask(local_78);
          Support::BitWordIterator<unsigned_int>::BitWordIterator(&local_7c,uVar4);
          local_80 = RATiedReg::useId(local_78);
          while (bVar1 = Support::BitWordIterator<unsigned_int>::hasNext(&local_7c), bVar1) {
            local_58 = Support::max<unsigned_int>(&local_58,&local_80);
            Support::BitWordIterator<unsigned_int>::next
                      ((BitWordIterator<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
            InstNode::rewriteIdAtIndex
                      ((InstNode *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                       (uint32_t)in_stack_fffffffffffffec8);
          }
          uVar4 = RATiedReg::outRewriteMask(local_78);
          Support::BitWordIterator<unsigned_int>::BitWordIterator(&local_84,uVar4);
          local_88 = RATiedReg::outId(local_78);
          while (bVar1 = Support::BitWordIterator<unsigned_int>::hasNext(&local_84), bVar1) {
            local_58 = Support::max<unsigned_int>(&local_58,&local_88);
            Support::BitWordIterator<unsigned_int>::next
                      ((BitWordIterator<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
            InstNode::rewriteIdAtIndex
                      ((InstNode *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                       (uint32_t)in_stack_fffffffffffffec8);
          }
        }
        bVar1 = RAInst::isTransformable((RAInst *)0x19e829);
        if ((bVar1) && (0xf < local_58)) {
          InstNode::id((InstNode *)0x19e84b);
          transformVexToEvex(in_stack_fffffffffffffed0);
          InstNode::setId((InstNode *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (InstId)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        }
        bVar1 = RAInst::hasInstRWFlag
                          ((RAInst *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (InstRWFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        if (((bVar1) && (bVar1 = InstNode::hasExtraReg((InstNode *)0x19e88d), !bVar1)) &&
           (uVar4 = InstNode::opCount(local_40), uVar4 == 2)) {
          in_stack_fffffffffffffee8 =
               (BaseBuilder *)
               InstNode::op(in_stack_fffffffffffffee0,
                            (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
          InstNode::op(in_stack_fffffffffffffee0,
                       (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
          bVar1 = Operand_::operator==
                            ((Operand_ *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (Operand_ *)in_stack_fffffffffffffec8);
          if (bVar1) {
            cc(in_RDI);
            BaseBuilder::removeNode
                      (in_stack_fffffffffffffee8,&in_stack_fffffffffffffee0->super_BaseNode);
            goto LAB_0019ebfc;
          }
        }
        NVar2 = BaseNode::type(&local_30->super_BaseNode);
        if ((NVar2 != kInst) &&
           (NVar2 = BaseNode::type(&local_30->super_BaseNode), NVar2 == kFuncRet)) {
          local_90 = RAInst::block(local_48);
          in_stack_fffffffffffffee0 = local_30;
          FuncNode::exitNode((in_RDI->super_BaseRAPass)._func);
          bVar1 = BaseRAPass::isNextTo
                            (in_stack_fffffffffffffed8,
                             (BaseNode *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             &in_stack_fffffffffffffec8->super_BaseNode);
          if (!bVar1) {
            in_stack_fffffffffffffed8 = (BaseRAPass *)cc(in_RDI);
            pBVar7 = BaseNode::prev(&local_30->super_BaseNode);
            BaseBuilder::_setCursor((BaseBuilder *)in_stack_fffffffffffffed8,pBVar7);
            FuncNode::exitNode((in_RDI->super_BaseRAPass)._func);
            LVar8 = LabelNode::label(in_stack_fffffffffffffec8);
            EVar5 = (*(in_RDI->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])
                              (in_RDI,local_a4,LVar8.super_Operand.super_Operand_._data);
            if (EVar5 != 0) {
              return EVar5;
            }
            local_94 = 0;
          }
          pBVar7 = BaseNode::prev(&local_30->super_BaseNode);
          cc(in_RDI);
          BaseBuilder::removeNode
                    (in_stack_fffffffffffffee8,&in_stack_fffffffffffffee0->super_BaseNode);
          RABlock::setLast(local_90,pBVar7);
        }
      }
      for (local_5c = 0; local_5c < local_54; local_5c = local_5c + 1) {
        this_00 = &local_50[local_5c].super_Operand_;
        bVar1 = Operand_::isMem((Operand_ *)0x19eaa7);
        if (bVar1) {
          this_01 = (LabelNode *)Operand_::as<asmjit::_abi_1_10::BaseMem>(this_00);
          bVar1 = BaseMem::isRegHome((BaseMem *)0x19eacc);
          if (bVar1) {
            uVar4 = BaseMem::baseId((BaseMem *)this_01);
            index = (uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20);
            uVar4 = Operand_::virtIdToIndex(uVar4);
            if (local_24 <= uVar4) {
              EVar5 = DebugUtils::errored(0x1e);
              return EVar5;
            }
            cc(in_RDI);
            this_02 = BaseCompiler::virtRegByIndex
                                ((BaseCompiler *)
                                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),index
                                );
            this_03 = VirtReg::workReg(this_02);
            if (this_03 == (RAWorkReg *)0x0) {
              DebugUtils::assertionFailed(in_stack_000002d0,in_stack_000002cc,in_stack_000002c0);
            }
            this_04 = RAWorkReg::stackSlot(this_03);
            offset_00 = RAStackSlot::offset(this_04);
            in_stack_fffffffffffffec8 = this_01;
            RVar3 = BaseReg::type((BaseReg *)0x19eba6);
            in_stack_fffffffffffffed4 = CONCAT13(RVar3,(int3)in_stack_fffffffffffffed4);
            RAStackSlot::baseRegId(this_04);
            BaseMem::_setBase((BaseMem *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (RegType)((ulong)in_stack_fffffffffffffec8 >> 0x38),
                              (uint32_t)in_stack_fffffffffffffec8);
            BaseMem::clearRegHome((BaseMem *)0x19ebd0);
            BaseMem::addOffsetLo32((BaseMem *)this_01,offset_00);
          }
        }
      }
    }
LAB_0019ebfc:
    local_30 = local_38;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error X86RAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();
      uint32_t maxRegId = 0;

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // This data is allocated by Zone passed to `runOnFunction()`, which will be reset after the RA pass finishes.
        // So reset this data to prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        // If the instruction contains pass data (raInst) then it was a subject for register allocation and must be
        // rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext()) {
            maxRegId = Support::max(maxRegId, useId);
            inst->rewriteIdAtIndex(useIt.next(), useId);
          }

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext()) {
            maxRegId = Support::max(maxRegId, outId);
            inst->rewriteIdAtIndex(outIt.next(), outId);
          }
        }

        // Transform VEX instruction to EVEX when necessary.
        if (raInst->isTransformable()) {
          if (maxRegId > 15) {
            inst->setId(transformVexToEvex(inst->id()));
          }
        }

        // Remove moves that do not do anything.
        //
        // Usually these moves are inserted during code generation and originally they used different registers. If RA
        // allocated these into the same register such redundant mov would appear.
        if (raInst->hasInstRWFlag(InstRWFlags::kMovOp) && !inst->hasExtraReg()) {
          if (inst->opCount() == 2) {
            if (inst->op(0) == inst->op(1)) {
              cc()->removeNode(node);
              goto Next;
            }
          }
        }

        if (ASMJIT_UNLIKELY(node->type() != NodeType::kInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit label is next to it (optimization) or
          // patched to an architecture dependent jump instruction that jumps to the function's exit before the epilog.
          if (node->type() == NodeType::kFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }
    }

Next:
    node = next;
  }

  return kErrorOk;
}